

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fkTriggerDelete(sqlite3 *dbMem,Trigger *p)

{
  TriggerStep *pTVar1;
  
  if (p != (Trigger *)0x0) {
    pTVar1 = p->step_list;
    if (pTVar1->pWhere != (Expr *)0x0) {
      sqlite3ExprDeleteNN(dbMem,pTVar1->pWhere);
    }
    if (pTVar1->pExprList != (ExprList *)0x0) {
      exprListDeleteNN(dbMem,pTVar1->pExprList);
    }
    if (pTVar1->pSelect != (Select *)0x0) {
      clearSelect(dbMem,pTVar1->pSelect,1);
    }
    if (p->pWhen != (Expr *)0x0) {
      sqlite3ExprDeleteNN(dbMem,p->pWhen);
    }
    sqlite3DbFreeNN(dbMem,p);
    return;
  }
  return;
}

Assistant:

static void fkTriggerDelete(sqlite3 *dbMem, Trigger *p){
  if( p ){
    TriggerStep *pStep = p->step_list;
    sqlite3ExprDelete(dbMem, pStep->pWhere);
    sqlite3ExprListDelete(dbMem, pStep->pExprList);
    sqlite3SelectDelete(dbMem, pStep->pSelect);
    sqlite3ExprDelete(dbMem, p->pWhen);
    sqlite3DbFree(dbMem, p);
  }
}